

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O1

void __thiscall MeCab::Dictionary::~Dictionary(Dictionary *this)

{
  pointer pcVar1;
  Mmap<char> *pMVar2;
  int in_ESI;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_00172cf8;
  close(this,in_ESI);
  Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::clear
            (&this->da_);
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  (this->dmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172c98;
  pMVar2 = (this->dmmap_).ptr_;
  if (pMVar2 != (Mmap<char> *)0x0) {
    (*pMVar2->_vptr_Mmap[1])();
    return;
  }
  return;
}

Assistant:

virtual ~Dictionary() { this->close(); }